

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOCK5ConnectionMaker.cpp
# Opt level: O0

void __thiscall
SOCK5ConnectionMaker::fill_fd_set(SOCK5ConnectionMaker *this,fd_set *rdfds,fd_set *wrfds)

{
  int iVar1;
  fd_set *wrfds_local;
  fd_set *rdfds_local;
  SOCK5ConnectionMaker *this_local;
  
  if ((this->firstStepCompleted & 1U) == 0) {
    iVar1 = this->client_sock_ / 0x40;
    rdfds->fds_bits[iVar1] =
         1L << ((byte)((long)this->client_sock_ % 0x40) & 0x3f) | rdfds->fds_bits[iVar1];
    iVar1 = this->client_sock_ / 0x40;
    wrfds->fds_bits[iVar1] =
         1L << ((byte)((long)this->client_sock_ % 0x40) & 0x3f) | wrfds->fds_bits[iVar1];
  }
  else {
    iVar1 = this->client_sock_ / 0x40;
    wrfds->fds_bits[iVar1] =
         1L << ((byte)((long)this->client_sock_ % 0x40) & 0x3f) | wrfds->fds_bits[iVar1];
    if (this->outputbuf_size == 0) {
      iVar1 = this->client_sock_ / 0x40;
      rdfds->fds_bits[iVar1] =
           1L << ((byte)((long)this->client_sock_ % 0x40) & 0x3f) | rdfds->fds_bits[iVar1];
    }
  }
  return;
}

Assistant:

void SOCK5ConnectionMaker::fill_fd_set(fd_set &rdfds, fd_set &wrfds) {
    if (!firstStepCompleted) {
        FD_SET(client_sock_, &rdfds);
        FD_SET(client_sock_, &wrfds);
    } else {
        FD_SET(client_sock_, &wrfds);
        if (outputbuf_size == 0) {
            FD_SET(client_sock_, &rdfds);
        }
    }
}